

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O1

unique_ptr<wabt::VarExpr<(wabt::ExprType)24>,_std::default_delete<wabt::VarExpr<(wabt::ExprType)24>_>_>
 __thiscall wabt::MakeUnique<wabt::VarExpr<(wabt::ExprType)24>,wabt::Var>(wabt *this,Var *args)

{
  undefined8 *puVar1;
  
  puVar1 = (undefined8 *)operator_new(0x88);
  puVar1[1] = 0;
  puVar1[2] = 0;
  puVar1[3] = 0;
  puVar1[4] = 0;
  *(undefined8 *)((long)puVar1 + 0x24) = 0;
  *(undefined8 *)((long)puVar1 + 0x2c) = 0;
  *(undefined4 *)(puVar1 + 7) = 0x18;
  *puVar1 = &PTR__VarExpr_0155bc30;
  Var::Var((Var *)(puVar1 + 8),args);
  *(undefined8 **)this = puVar1;
  return (__uniq_ptr_data<wabt::VarExpr<(wabt::ExprType)24>,_std::default_delete<wabt::VarExpr<(wabt::ExprType)24>_>,_true,_true>
          )(__uniq_ptr_data<wabt::VarExpr<(wabt::ExprType)24>,_std::default_delete<wabt::VarExpr<(wabt::ExprType)24>_>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}